

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O0

void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *p,Vec_Int_t *vMap)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Bac_NameType_t BVar4;
  char *pPref;
  bool bVar5;
  int local_74;
  int local_3c;
  int Range;
  int nNames;
  int nPos;
  int nPis;
  int nDigits;
  int iBit;
  int iName;
  int iTerm;
  int iObj;
  int k;
  Vec_Int_t *vMap_local;
  Bac_Ntk_t *p_local;
  
  nPis = -1;
  nNames = 0;
  Range = 0;
  local_3c = 1;
  iVar1 = Bac_NtkHasNames(p);
  if (iVar1 == 0) {
    Bac_NtkStartNames(p);
  }
  uVar2 = Bac_ManAssignCountNames(p);
  iVar1 = Abc_Base10Log(uVar2);
  for (iName = 0; iVar3 = Bac_NtkObjNum(p), iName < iVar3; iName = iName + 1) {
    iVar3 = Bac_ObjIsCi(p,iName);
    if ((iVar3 != 0) && (iVar3 = Bac_ObjNameInt(p,iName), iVar3 != 0)) {
      iVar3 = Bac_ObjNameId(p,iName);
      Vec_IntWriteEntry(vMap,iVar3,1);
    }
  }
  for (iName = 0; iVar3 = Bac_NtkObjNum(p), iName < iVar3; iName = iName + 1) {
    iVar3 = Bac_ObjIsBox(p,iName);
    if ((iVar3 != 0) && (iVar3 = Bac_ObjNameInt(p,iName), iVar3 != 0)) {
      iVar3 = Bac_ObjNameId(p,iName);
      Vec_IntWriteEntry(vMap,iVar3,1);
    }
  }
  for (iName = 0; iVar3 = Bac_NtkObjNum(p), iName < iVar3; iName = iName + 1) {
    iVar3 = Bac_ObjIsCi(p,iName);
    if (iVar3 != 0) {
      iVar3 = Bac_ObjNameInt(p,iName);
      if (iVar3 == 0) {
        iVar3 = Bac_ObjBit(p,iName);
        if (iVar3 == 0) {
          iVar3 = Bac_ObjIsPi(p,iName);
          if (iVar3 == 0) {
            local_74 = Bac_BoxBoRange(p,iName);
          }
          else {
            local_74 = Bac_ObjPiRange(p,iName);
          }
          iVar3 = Bac_ObjIsPi(p,iName);
          pPref = "n";
          if (iVar3 != 0) {
            pPref = "i";
          }
          iVar3 = Bac_ManAssignInternTwo(p,local_3c,iVar1,pPref,vMap);
          if (local_74 == 1) {
            iVar3 = Abc_Var2Lit2(iVar3,0);
            Bac_ObjSetName(p,iName,iVar3);
          }
          else {
            iVar3 = Abc_Var2Lit2(iVar3,1);
            Bac_ObjSetName(p,iName,iVar3);
          }
          nPis = 1;
          local_3c = local_3c + 1;
        }
        else {
          if (nPis < 1) {
            __assert_fail("iBit > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                          ,0x148,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
          }
          iVar3 = Abc_Var2Lit2(nPis,3);
          Bac_ObjSetName(p,iName,iVar3);
          nPis = nPis + 1;
        }
      }
      else {
        nPis = -1;
      }
    }
  }
  iVar1 = Bac_NtkInfoNum(p);
  if (iVar1 != 0) {
    for (iTerm = 0; iVar1 = Bac_NtkInfoNum(p), iTerm < iVar1; iTerm = iTerm + 1) {
      iVar1 = Bac_NtkInfoType(p,iTerm);
      if (iVar1 == 1) {
        iVar1 = Bac_NtkPi(p,nNames);
        iVar3 = Bac_ObjBit(p,iVar1);
        if (iVar3 != 0) {
          __assert_fail("!Bac_ObjBit(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                        ,0x160,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
        }
        BVar4 = Bac_ObjNameType(p,iVar1);
        if (BAC_NAME_WORD < BVar4) {
          __assert_fail("Bac_ObjNameType(p, iObj) <= BAC_NAME_WORD",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                        ,0x161,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
        }
        iVar1 = Bac_ObjNameId(p,iVar1);
        iVar1 = Abc_Var2Lit2(iVar1,1);
        Bac_NtkSetInfoName(p,iTerm,iVar1);
        iVar1 = Bac_NtkInfoRange(p,iTerm);
        nNames = iVar1 + nNames;
      }
      else {
        iVar1 = Bac_NtkInfoType(p,iTerm);
        if (iVar1 != 2) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                        ,0x16e,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
        }
        iVar1 = Bac_NtkPo(p,Range);
        iVar3 = Bac_ObjBit(p,iVar1);
        if (iVar3 != 0) {
          __assert_fail("!Bac_ObjBit(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                        ,0x168,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
        }
        iVar1 = Bac_ObjFanin(p,iVar1);
        BVar4 = Bac_ObjNameType(p,iVar1);
        if (BAC_NAME_WORD < BVar4) {
          __assert_fail("Bac_ObjNameType(p, iObj) <= BAC_NAME_WORD",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                        ,0x16a,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
        }
        iVar1 = Bac_ObjNameId(p,iVar1);
        iVar1 = Abc_Var2Lit2(iVar1,2);
        Bac_NtkSetInfoName(p,iTerm,iVar1);
        iVar1 = Bac_NtkInfoRange(p,iTerm);
        Range = iVar1 + Range;
      }
    }
    iVar1 = Bac_NtkPiNum(p);
    if (nNames != iVar1) {
      __assert_fail("nPis == Bac_NtkPiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                    ,0x170,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
    }
    iVar1 = Bac_NtkPoNum(p);
    if (Range != iVar1) {
      __assert_fail("nPos == Bac_NtkPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                    ,0x171,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
    }
  }
  uVar2 = Bac_NtkObjNum(p);
  iVar1 = Abc_Base10Log(uVar2);
  for (iName = 0; iVar3 = Bac_NtkObjNum(p), iName < iVar3; iName = iName + 1) {
    iVar3 = Bac_ObjIsBox(p,iName);
    if ((iVar3 != 0) && (iVar3 = Bac_ObjNameInt(p,iName), iVar3 == 0)) {
      iVar3 = Bac_ManAssignInternTwo(p,iName,iVar1,"g",vMap);
      iVar3 = Abc_Var2Lit2(iVar3,0);
      Bac_ObjSetName(p,iName,iVar3);
    }
  }
  for (iTerm = 0; iVar1 = Bac_NtkPiNum(p), iTerm < iVar1; iTerm = iTerm + 1) {
    iVar1 = Bac_NtkPi(p,iTerm);
    BVar4 = Bac_ObjNameType(p,iVar1);
    if (BVar4 < BAC_NAME_INFO) {
      iVar1 = Bac_ObjNameId(p,iVar1);
      Vec_IntWriteEntry(vMap,iVar1,0);
    }
  }
  for (iName = 0; iVar1 = Bac_NtkObjNum(p), iName < iVar1; iName = iName + 1) {
    iVar1 = Bac_ObjIsBox(p,iName);
    if (iVar1 != 0) {
      iVar1 = Bac_ObjNameId(p,iName);
      Vec_IntWriteEntry(vMap,iVar1,0);
      iBit = iName;
      while( true ) {
        iBit = iBit + 1;
        iVar1 = Bac_NtkObjNum(p);
        bVar5 = false;
        if (iBit < iVar1) {
          iVar1 = Bac_ObjIsBo(p,iBit);
          bVar5 = iVar1 != 0;
        }
        if (!bVar5) break;
        BVar4 = Bac_ObjNameType(p,iBit);
        if (BVar4 < BAC_NAME_INFO) {
          iVar1 = Bac_ObjNameId(p,iBit);
          Vec_IntWriteEntry(vMap,iVar1,0);
        }
      }
    }
  }
  return;
}

Assistant:

void Bac_ManAssignInternWordNamesNtk( Bac_Ntk_t * p, Vec_Int_t * vMap )
{
    int k, iObj, iTerm, iName = -1, iBit = -1;
    int nDigits, nPis = 0, nPos = 0, nNames = 1;
    // start names
    if ( !Bac_NtkHasNames(p) )
        Bac_NtkStartNames(p);
    nDigits = Abc_Base10Log( Bac_ManAssignCountNames(p) );
    // populate map with the currently used names
    Bac_NtkForEachCi( p, iObj )
        if ( Bac_ObjNameInt(p, iObj) )
            Vec_IntWriteEntry( vMap, Bac_ObjNameId(p, iObj), 1 );
    Bac_NtkForEachBox( p, iObj )
        if ( Bac_ObjNameInt(p, iObj) )
            Vec_IntWriteEntry( vMap, Bac_ObjNameId(p, iObj), 1 );
    // assign CI names
    Bac_NtkForEachCi( p, iObj )
    {
        if ( Bac_ObjNameInt(p, iObj) )
        {
            iName = -1;
            iBit = -1;
            continue;
        }
        if ( Bac_ObjBit(p, iObj) )
        {
            assert( iBit > 0 );
            Bac_ObjSetName( p, iObj, Abc_Var2Lit2(iBit++, BAC_NAME_INDEX) );
        }
        else
        {
            //int Type = Bac_ObjType(p, iObj);
            int Range = Bac_ObjIsPi(p, iObj) ? Bac_ObjPiRange(p, iObj) : Bac_BoxBoRange(p, iObj);
            iName = Bac_ManAssignInternTwo( p, nNames++, nDigits, (char*)(Bac_ObjIsPi(p, iObj) ? "i":"n"), vMap );
            if ( Range == 1 )
                Bac_ObjSetName( p, iObj, Abc_Var2Lit2(iName, BAC_NAME_BIN) );
            else
                Bac_ObjSetName( p, iObj, Abc_Var2Lit2(iName, BAC_NAME_WORD) );
            iBit = 1;
        }
    }
    // transfer names to the interface
    if ( Bac_NtkInfoNum(p) )
    {
        for ( k = 0; k < Bac_NtkInfoNum(p); k++ )
        {
            //char * pName = Bac_NtkName(p);
            if ( Bac_NtkInfoType(p, k) == 1 ) // PI
            {
                iObj = Bac_NtkPi(p, nPis);
                assert( !Bac_ObjBit(p, iObj) );
                assert( Bac_ObjNameType(p, iObj) <= BAC_NAME_WORD );
                Bac_NtkSetInfoName( p, k, Abc_Var2Lit2(Bac_ObjNameId(p, iObj), 1) );
                nPis += Bac_NtkInfoRange(p, k);
            }
            else if ( Bac_NtkInfoType(p, k) == 2 ) // PO
            {
                iObj = Bac_NtkPo(p, nPos);
                assert( !Bac_ObjBit(p, iObj) );
                iObj = Bac_ObjFanin(p, iObj);
                assert( Bac_ObjNameType(p, iObj) <= BAC_NAME_WORD );
                Bac_NtkSetInfoName( p, k, Abc_Var2Lit2(Bac_ObjNameId(p, iObj), 2) );
                nPos += Bac_NtkInfoRange(p, k);
            }
            else assert( 0 );
        }
        assert( nPis == Bac_NtkPiNum(p) );
        assert( nPos == Bac_NtkPoNum(p) );
    }
    // assign instance names
    nDigits = Abc_Base10Log( Bac_NtkObjNum(p) );
    Bac_NtkForEachBox( p, iObj )
        if ( !Bac_ObjNameInt(p, iObj) )
        {
            iName = Bac_ManAssignInternTwo( p, iObj, nDigits, "g", vMap );
            Bac_ObjSetName( p, iObj, Abc_Var2Lit2(iName, BAC_NAME_BIN) );
        }
    // unmark all names
    Bac_NtkForEachPi( p, iObj, k )
        if ( Bac_ObjNameType(p, iObj) <= BAC_NAME_WORD )
            Vec_IntWriteEntry( vMap, Bac_ObjNameId(p, iObj), 0 );
    Bac_NtkForEachBox( p, iObj )
    {
        Vec_IntWriteEntry( vMap, Bac_ObjNameId(p, iObj), 0 );
        Bac_BoxForEachBo( p, iObj, iTerm, k )
            if ( Bac_ObjNameType(p, iTerm) <= BAC_NAME_WORD )
                Vec_IntWriteEntry( vMap, Bac_ObjNameId(p, iTerm), 0 );
    }
//    printf( "Generated %d word-level names.\n", nNames-1 );
}